

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STP_BV.cpp
# Opt level: O3

void __thiscall sch::STP_BV::updateFastPatches(STP_BV *this)

{
  size_t i;
  ulong uVar1;
  STP_Feature **ppSVar2;
  long lVar3;
  ulong uVar4;
  pointer ppSVar5;
  
  if (this->m_fastPatches != (STP_Feature **)0x0) {
    operator_delete__(this->m_fastPatches);
  }
  ppSVar5 = (this->m_patches).
            super__Vector_base<sch::STP_Feature_*,_std::allocator<sch::STP_Feature_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar1 = (long)(this->m_patches).
                super__Vector_base<sch::STP_Feature_*,_std::allocator<sch::STP_Feature_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppSVar5;
  if (uVar1 == 0) {
    this->m_fastPatches = (STP_Feature **)0x0;
    this->m_lastPatches = (STP_Feature **)0x0;
    this->m_patchesSize = 0;
  }
  else {
    uVar4 = 0xffffffffffffffff;
    if (-1 < (long)uVar1) {
      uVar4 = uVar1;
    }
    ppSVar2 = (STP_Feature **)operator_new__(uVar4);
    this->m_fastPatches = ppSVar2;
    uVar1 = 0;
    do {
      this->m_fastPatches[uVar1] = ppSVar5[uVar1];
      uVar1 = uVar1 + 1;
      ppSVar5 = (this->m_patches).
                super__Vector_base<sch::STP_Feature_*,_std::allocator<sch::STP_Feature_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar3 = (long)(this->m_patches).
                    super__Vector_base<sch::STP_Feature_*,_std::allocator<sch::STP_Feature_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar5;
      uVar4 = lVar3 >> 3;
    } while (uVar1 < uVar4);
    this->m_lastPatches = (STP_Feature **)(lVar3 + (long)this->m_fastPatches);
    this->m_patchesSize = (int)uVar4;
  }
  return;
}

Assistant:

void STP_BV::updateFastPatches()
{
  if(m_fastPatches != NULL)
  {
    delete[] m_fastPatches;
  }

  if(m_patches.size() > 0)
  {
    m_fastPatches = new STP_Feature *[m_patches.size()];
    for(size_t i = 0; i < m_patches.size(); i++)
    {
      m_fastPatches[i] = m_patches[i];
    }

    m_lastPatches = &m_fastPatches[m_patches.size()];
    m_patchesSize = static_cast<int>(m_patches.size());
  }
  else
  {
    m_patchesSize = 0;
    m_lastPatches = m_fastPatches = NULL;
  }
}